

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

char * UnicodeToString(char *cc)

{
  size_t sVar1;
  char *pcVar2;
  size_t index;
  int local_1c;
  int local_18;
  int c;
  int size;
  int ndx;
  char *cc_local;
  
  _size = cc;
  sVar1 = strlen(cc);
  TArray<char,_char>::Resize(&out,(int)sVar1 + 1);
  c = 0;
  for (; *_size != '\0'; _size = _size + local_18) {
    local_1c = utf8_decode(_size,&local_18);
    if ((local_1c < 0) || (0xff < local_1c)) {
      local_1c = 0x3f;
    }
    index = (size_t)c;
    c = c + 1;
    pcVar2 = TArray<char,_char>::operator[](&out,index);
    *pcVar2 = (char)local_1c;
  }
  pcVar2 = TArray<char,_char>::operator[](&out,(long)c);
  *pcVar2 = '\0';
  pcVar2 = TArray<char,_char>::operator[](&out,0);
  return pcVar2;
}

Assistant:

static const char *UnicodeToString(const char *cc)
{
	out.Resize((unsigned)strlen(cc) + 1);
	int ndx = 0;
	while (*cc != 0)
	{
		int size;
		int c = utf8_decode(cc, &size);
		if (c < 0 || c > 255) c = '?';
		out[ndx++] = c;
		cc += size;
	}
	out[ndx] = 0;
	return &out[0];
}